

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

Bool prvTidyTidyMetaCharset(TidyDocImpl *doc)

{
  TidyAllocator *pTVar1;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ctmbstr str;
  Node *element;
  AttVal *pAVar9;
  AttVal *pAVar10;
  tmbstr ptVar11;
  Bool BVar12;
  Bool BVar13;
  Node *pNVar14;
  Node *pNVar15;
  TidyBuffer charsetString;
  TidyBuffer buf;
  
  uVar6 = *(uint *)((doc->config).value + 0x3c);
  str = prvTidyGetEncodingNameFromTidyId(uVar6);
  element = prvTidyFindHEAD(doc);
  BVar12 = no;
  BVar13 = no;
  if (str != (ctmbstr)0x0 && element != (Node *)0x0) {
    iVar8 = *(int *)((doc->config).value + 0x35);
    uVar5 = prvTidytmbstrlen(str);
    if ((((uVar5 != 0) && (BVar13 = BVar12, uVar6 != 0)) && (uVar6 != 5)) &&
       (*(int *)((doc->config).value + 6) != 1)) {
      tidyBufInit(&charsetString);
      tidyBufClear(&charsetString);
      tidyBufAppend(&charsetString,"charset=",8);
      uVar6 = prvTidytmbstrlen(str);
      tidyBufAppend(&charsetString,str,uVar6);
      tidyBufAppend(&charsetString,"",1);
      pNVar14 = element->content;
      bVar3 = false;
      while (pNVar14 != (Node *)0x0) {
        pNVar15 = pNVar14;
        if ((pNVar14->tag == (Dict *)0x0) || (pNVar14->tag->id != TidyTag_META)) goto LAB_0014976a;
        pAVar9 = prvTidyAttrGetById(pNVar14,TidyAttr_CHARSET);
        pAVar10 = prvTidyAttrGetById(pNVar14,TidyAttr_HTTP_EQUIV);
        if (pAVar9 == (AttVal *)0x0 && pAVar10 == (AttVal *)0x0) goto LAB_0014976a;
        if (pAVar9 == (AttVal *)0x0 || pAVar10 != (AttVal *)0x0) {
          if (pAVar10 == (AttVal *)0x0 || pAVar9 != (AttVal *)0x0) {
            if (pAVar9 != (AttVal *)0x0 && pAVar10 != (AttVal *)0x0) goto LAB_001495b4;
          }
          else {
            pAVar9 = prvTidyAttrGetById(pNVar14,TidyAttr_CONTENT);
            if (pAVar9 != (AttVal *)0x0) {
              if (pAVar10->value == (ctmbstr)0x0) goto LAB_001495b4;
              iVar7 = prvTidytmbstrcasecmp(pAVar10->value,"content-type");
              if ((iVar7 == 0) && (pAVar9->value != (ctmbstr)0x0)) {
                iVar7 = prvTidytmbstrcasecmp(pAVar9->value,(ctmbstr)charsetString.bp);
                if (iVar7 == 0) {
                  bVar4 = !bVar3;
                  bVar3 = true;
                  if (bVar4) goto LAB_00149763;
                }
                else {
                  bVar4 = !bVar3;
                  bVar3 = true;
                  if (bVar4) {
                    pTVar1 = doc->allocator;
                    p_Var2 = pTVar1->vtbl->alloc;
                    uVar6 = prvTidytmbstrlen(str);
                    ptVar11 = (tmbstr)(*p_Var2)(pTVar1,(long)uVar6 + 0x14);
                    prvTidytmbstrcpy(ptVar11,"text/html; charset=");
                    prvTidytmbstrcpy(ptVar11 + 0x13,str);
                    if (*(int *)((doc->config).value + 0x4d) != 0) {
                      prvTidyReportAttrError(doc,pNVar14,pAVar9,0x228);
                    }
                    (*doc->allocator->vtbl->free)(doc->allocator,pAVar9->value);
                    pAVar9->value = ptVar11;
LAB_00149763:
                    bVar3 = true;
                    goto LAB_0014976a;
                  }
                }
                goto LAB_001495b4;
              }
            }
          }
          goto LAB_0014976a;
        }
        if ((!bVar3) && (pAVar9->value != (ctmbstr)0x0)) {
          iVar7 = prvTidytmbstrcasecmp(pAVar9->value,str);
          if (iVar7 != 0) {
            pTVar1 = doc->allocator;
            p_Var2 = pTVar1->vtbl->alloc;
            uVar6 = prvTidytmbstrlen(str);
            ptVar11 = (tmbstr)(*p_Var2)(pTVar1,(long)uVar6 + 1);
            prvTidytmbstrcpy(ptVar11,str);
            prvTidyReportAttrError(doc,pNVar14,pAVar9,0x228);
            (*doc->allocator->vtbl->free)(doc->allocator,pAVar9->value);
            pAVar9->value = ptVar11;
          }
          if (pNVar14 != element->content->next) {
            prvTidyRemoveNode(pNVar14);
            prvTidyInsertNodeAtStart(element,pNVar14);
          }
          goto LAB_00149763;
        }
LAB_001495b4:
        pNVar15 = pNVar14->prev;
        prvTidyReport(doc,element,pNVar14,0x235);
        prvTidyDiscardElement(doc,pNVar14);
        pNVar14 = (Node *)0x0;
        if (pNVar15 != (Node *)0x0) {
LAB_0014976a:
          pNVar14 = pNVar15->next;
        }
      }
      if (!bVar3 && iVar8 != 0) {
        pNVar14 = prvTidyInferredTag(doc,TidyTag_META);
        iVar8 = prvTidyHTMLVersion(doc);
        if ((iVar8 == 0x40000) || (iVar8 == 0x20000)) {
          prvTidyAddAttribute(doc,pNVar14,"charset",str);
        }
        else {
          tidyBufInit(&buf);
          tidyBufAppend(&buf,"text/html; ",0xb);
          uVar6 = prvTidytmbstrlen((ctmbstr)charsetString.bp);
          tidyBufAppend(&buf,charsetString.bp,uVar6);
          tidyBufAppend(&buf,"",1);
          prvTidyAddAttribute(doc,pNVar14,"http-equiv","Content-Type");
          prvTidyAddAttribute(doc,pNVar14,"content",(ctmbstr)buf.bp);
          tidyBufFree(&buf);
        }
        prvTidyInsertNodeAtStart(element,pNVar14);
        prvTidyReport(doc,pNVar14,element,0x222);
      }
      tidyBufFree(&charsetString);
      BVar13 = yes;
    }
  }
  return BVar13;
}

Assistant:

Bool TY_(TidyMetaCharset)(TidyDocImpl* doc)
{
    AttVal *charsetAttr;
    AttVal *contentAttr;
    AttVal *httpEquivAttr;
    Bool charsetFound = no;
    uint outenc = cfg(doc, TidyOutCharEncoding);
    ctmbstr enc = TY_(GetEncodingNameFromTidyId)(outenc);
    Node *currentNode;
    Node *head = TY_(FindHEAD)(doc);
    Node *metaTag;
    Node *prevNode;
    TidyBuffer buf;
    TidyBuffer charsetString;
    /* tmbstr httpEquivAttrValue; */
    /* tmbstr lcontent; */
    tmbstr newValue;
    Bool add_meta = cfgBool(doc, TidyMetaCharset);

    /* We can't do anything we don't have a head or encoding is NULL */
    if (!head || !enc || !TY_(tmbstrlen)(enc))
        return no;
    if (outenc == RAW)
        return no;
#ifndef NO_NATIVE_ISO2022_SUPPORT
    if (outenc == ISO2022)
        return no;
#endif
    if (cfgAutoBool(doc, TidyBodyOnly) == TidyYesState)
        return no; /* nothing to do here if showing body only */

    tidyBufInit(&charsetString);
    /* Set up the content test 'charset=value' */
    tidyBufClear(&charsetString);
    tidyBufAppend(&charsetString, "charset=", 8);
    tidyBufAppend(&charsetString, (char*)enc, TY_(tmbstrlen)(enc));
    tidyBufAppend(&charsetString, "\0", 1); /* zero terminate the buffer */
    /* process the children of the head */
    /* Issue #656 - guard against 'currentNode' being set NULL in loop */
    for (currentNode = head->content; currentNode; 
        currentNode = (currentNode ? currentNode->next : NULL))
    {
        if (!nodeIsMETA(currentNode))
            continue;   /* not a meta node */
        charsetAttr = attrGetCHARSET(currentNode);
        httpEquivAttr = attrGetHTTP_EQUIV(currentNode);
        if (!charsetAttr && !httpEquivAttr)
            continue;   /* has no charset attribute */
                        /*
                        Meta charset comes in quite a few flavors:
                        1. <meta charset="value"> - expected for (X)HTML5.
                        */
        if (charsetAttr && !httpEquivAttr)
        {
            /* we already found one, so remove the rest. */
            if (charsetFound || !charsetAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            charsetFound = yes;
            /* Fix mismatched attribute value */
            if (TY_(tmbstrcasecmp)(charsetAttr->value, enc) != 0)
            {
                newValue = (tmbstr)TidyDocAlloc(doc, TY_(tmbstrlen)(enc) + 1);   /* allocate + 1 for 0 */
                TY_(tmbstrcpy)(newValue, enc);
                /* Note: previously http-equiv had been modified, without warning
                in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
                */
                TY_(ReportAttrError)(doc, currentNode, charsetAttr, ATTRIBUTE_VALUE_REPLACED);
                TidyDocFree(doc, charsetAttr->value);   /* free current value */
                charsetAttr->value = newValue;
            }
            /* Make sure it's the first element. */
            if (currentNode != head->content->next) {
                TY_(RemoveNode)(currentNode);
                TY_(InsertNodeAtStart)(head, currentNode);
            }
            continue;
        }
        /*
        2. <meta http-equiv="content-type" content="text/html; charset=UTF-8">
        expected for HTML4. This is normally ok - but can clash.
        */
        if (httpEquivAttr && !charsetAttr)
        {
            contentAttr = TY_(AttrGetById)(currentNode, TidyAttr_CONTENT);
            if (!contentAttr)
                continue;   /* has no 'content' attribute */
            if (!httpEquivAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            /* httpEquivAttrValue = TY_(tmbstrtolower)(httpEquivAttr->value); */
            if (TY_(tmbstrcasecmp)(httpEquivAttr->value, (tmbstr) "content-type") != 0)
                continue;   /* is not 'content-type' */
            if (!contentAttr->value)
            {
                continue; /* has no 'content' attribute has NO VALUE! */
            }
            /* check encoding matches
            If a miss-match found here, fix it. previous silently done
            in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
            lcontent = TY_(tmbstrtolower)(contentAttr->value);
            */
            if (TY_(tmbstrcasecmp)(contentAttr->value, (ctmbstr)charsetString.bp) == 0)
            {
                /* we already found one, so remove the rest. */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                    continue;
                }
                charsetFound = yes;
            }
            else
            {
                /* fix a mismatch */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                }
                else
                {
                    /* correct the content */
                    newValue = (tmbstr)TidyDocAlloc(doc, 19 + TY_(tmbstrlen)(enc) + 1);
                    TY_(tmbstrcpy)(newValue, "text/html; charset=");
                    TY_(tmbstrcpy)(newValue + 19, enc);
                    if (cfgBool(doc, TidyShowMetaChange))   /* Issue #456 - backward compatibility only */
                        TY_(ReportAttrError)(doc, currentNode, contentAttr, ATTRIBUTE_VALUE_REPLACED);
                    TidyDocFree(doc, contentAttr->value);
                    contentAttr->value = newValue;
                    charsetFound = yes;
                }
            }
            continue;
        }
        /*
        3. <meta charset="utf-8" http-equiv="Content-Type" content="...">
        This is generally bad. Discard and warn.
        */
        if (httpEquivAttr && charsetAttr)
        {
            /* printf("WARN ABOUT HTTP EQUIV AND CHARSET ATTR! \n"); */
            prevNode = currentNode->prev;
            TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
            TY_(DiscardElement)(doc, currentNode);
            currentNode = prevNode;
        }
    }

    /* completed head scan - add appropriate meta - if 'yes' and none exists */
    if (add_meta && !charsetFound)
    {
        /* add appropriate meta charset tag - no warning */
        metaTag = TY_(InferredTag)(doc, TidyTag_META);
        switch (TY_(HTMLVersion)(doc))
        {
        case HT50:
        case XH50:
            TY_(AddAttribute)(doc, metaTag, "charset", enc);
            break;
        default:
            tidyBufInit(&buf);
            tidyBufAppend(&buf, "text/html; ", 11);
            tidyBufAppend(&buf, charsetString.bp, TY_(tmbstrlen)((ctmbstr)charsetString.bp));
            tidyBufAppend(&buf, "\0", 1);   /* zero terminate the buffer */
            TY_(AddAttribute)(doc, metaTag, "http-equiv", "Content-Type"); /* add 'http-equiv' const. */
            TY_(AddAttribute)(doc, metaTag, "content", (char*)buf.bp);  /* add 'content="<enc>"' */
            tidyBufFree(&buf);
        }
        TY_(InsertNodeAtStart)(head, metaTag);
        TY_(Report)(doc, metaTag, head, ADDED_MISSING_CHARSET); /* actually just 'Info:' */
    }
    tidyBufFree(&charsetString);
    return yes;
}